

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

int64_t __thiscall wasm::Random::get64(Random *this)

{
  int32_t iVar1;
  int32_t iVar2;
  uint64_t temp;
  Random *this_local;
  
  iVar1 = get32(this);
  iVar2 = get32(this);
  return (long)iVar1 << 0x20 | (long)iVar2;
}

Assistant:

int64_t Random::get64() {
  auto temp = uint64_t(get32()) << 32;
  return temp | uint64_t(get32());
}